

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O2

void __thiscall
Refal2::COperationsBuilder::AddMatchRight_E
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  undefined4 uStack_20;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    if (saveInTable) {
      addOperation_VE(this,OT_MatchRightBeginSaveToTable_E);
      addOperation(this,OT_MatchRightBeginSaveToTable_V);
      uStack_20 = OT_MatchRightSaveToTable_E;
    }
    else {
      addOperation_VE(this,OT_MatchRightBegin_E);
      addOperation(this,OT_MatchRightBegin_V);
      uStack_20 = OT_MatchRight_E;
    }
    addOperation(this,uStack_20);
    return;
  }
  if (saveInTable) {
    addOperation_VE(this,OT_MatchRightBeginSaveToTable_E);
    addQualifierIndexOperation(this,OT_MatchRightWithQulifierBeginSaveToTable_V,qualifier);
    uStack_20 = OT_MatchRightWithQulifierSaveToTable_E;
  }
  else {
    addOperation_VE(this,OT_MatchRightBegin_E);
    addQualifierIndexOperation(this,OT_MatchRightWithQulifierBegin_V,qualifier);
    uStack_20 = OT_MatchRightWithQulifier_E;
  }
  addQualifierIndexOperation(this,uStack_20,qualifier);
  return;
}

Assistant:

void COperationsBuilder::AddMatchRight_E( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		if( saveInTable ) {
			addOperation_VE( OT_MatchRightBeginSaveToTable_E );
			addNoArgumensOperation( OT_MatchRightBeginSaveToTable_V );
			addNoArgumensOperation( OT_MatchRightSaveToTable_E );
		} else {
			addOperation_VE( OT_MatchRightBegin_E );
			addNoArgumensOperation( OT_MatchRightBegin_V );
			addNoArgumensOperation( OT_MatchRight_E );
		}
	} else {
		if( saveInTable ) {
			addOperation_VE( OT_MatchRightBeginSaveToTable_E );
			addQualifierIndexOperation(
				OT_MatchRightWithQulifierBeginSaveToTable_V, qualifier );
			addQualifierIndexOperation( OT_MatchRightWithQulifierSaveToTable_E,
				qualifier );
		} else {
			addOperation_VE( OT_MatchRightBegin_E );
			addQualifierIndexOperation(
				OT_MatchRightWithQulifierBegin_V, qualifier );
			addQualifierIndexOperation( OT_MatchRightWithQulifier_E,
				qualifier );
		}
	}
}